

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O0

void __thiscall
slang::ast::ASTSerializer::writeLink(ASTSerializer *this,string_view name,Symbol *value)

{
  string_view value_00;
  string_view name_00;
  undefined1 uVar1;
  long in_RCX;
  char *in_RDI;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  Type *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  allocator<char> *local_f8;
  Type *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  
  name_00._M_str = (char *)in_stack_ffffffffffffff30;
  name_00._M_len = (size_t)in_stack_ffffffffffffff28;
  JsonWriter::writeProperty((JsonWriter *)in_stack_ffffffffffffff20,name_00);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffef0);
  if ((in_RDI[0x10] & 1U) != 0) {
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff18);
    std::operator+(in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::__cxx11::string::~string(in_stack_fffffffffffffee0);
    std::__cxx11::string::~string(in_stack_fffffffffffffee0);
  }
  uVar1 = Symbol::isType((Symbol *)0x4f069b);
  if ((bool)uVar1) {
    in_stack_fffffffffffffef0 = Symbol::as<slang::ast::Type>((Symbol *)0x4f06b8);
    Type::toString_abi_cxx11_(in_stack_ffffffffffffff18);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string(in_stack_fffffffffffffee0);
  }
  else {
    in_stack_fffffffffffffee0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RCX + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_ffffffffffffff20,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff18,
               local_f8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string(in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1f);
  }
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffee0);
  value_00._M_len._7_1_ = uVar1;
  value_00._M_len._0_7_ = in_stack_fffffffffffffef8;
  value_00._M_str = in_RDI;
  JsonWriter::writeValue((JsonWriter *)in_stack_fffffffffffffef0,value_00);
  std::__cxx11::string::~string(in_stack_fffffffffffffee0);
  return;
}

Assistant:

void ASTSerializer::writeLink(std::string_view name, const Symbol& value) {
    writer.writeProperty(name);

    std::string str;
    if (includeAddrs)
        str = std::to_string(uintptr_t(&value)) + " ";

    if (value.isType())
        str += value.as<Type>().toString();
    else
        str += std::string(value.name);

    writer.writeValue(str);
}